

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool __thiscall Analyzer::nodeCannotBeNull(Analyzer *this,Node *n)

{
  bool local_11;
  Node *n_local;
  Analyzer *this_local;
  
  if (((((n->nodeType != PNT_BINARY_OP) || (n->tok->type == TK_NULLCOALESCE)) ||
       (local_11 = true, n->tok->type == TK_MODULO)) &&
      (((local_11 = true, n->nodeType != PNT_UNARY_PRE_OP &&
        (local_11 = true, n->nodeType != PNT_UNARY_POST_OP)) &&
       ((local_11 = true, n->nodeType != PNT_INTEGER &&
        ((local_11 = true, n->nodeType != PNT_BOOL && (local_11 = true, n->nodeType != PNT_FLOAT))))
       )))) && ((local_11 = true, n->nodeType != PNT_STRING &&
                (((((local_11 = true, n->nodeType != PNT_ARRAY_CREATION &&
                    (local_11 = true, n->nodeType != PNT_TABLE_CREATION)) &&
                   (local_11 = true, n->nodeType != PNT_LAMBDA)) &&
                  ((local_11 = true, n->nodeType != PNT_FUNCTION &&
                   (local_11 = true, n->nodeType != PNT_LOCAL_FUNCTION)))) &&
                 (local_11 = true, n->nodeType != PNT_CLASS)))))) {
    local_11 = n->nodeType == PNT_LOCAL_CLASS;
  }
  return local_11;
}

Assistant:

bool nodeCannotBeNull(Node * n)
  {
    return (n->nodeType == PNT_BINARY_OP && n->tok.type != TK_NULLCOALESCE && n->tok.type != TK_MODULO) ||
        n->nodeType == PNT_UNARY_PRE_OP || n->nodeType == PNT_UNARY_POST_OP ||
        n->nodeType == PNT_INTEGER || n->nodeType == PNT_BOOL || n->nodeType == PNT_FLOAT ||
        n->nodeType == PNT_STRING || n->nodeType == PNT_ARRAY_CREATION ||
        n->nodeType == PNT_TABLE_CREATION || n->nodeType == PNT_LAMBDA || n->nodeType == PNT_FUNCTION ||
        n->nodeType == PNT_LOCAL_FUNCTION || n->nodeType == PNT_CLASS || n->nodeType == PNT_LOCAL_CLASS;
  }